

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O3

RB180 * __thiscall amrex::FabArrayBase::getRB180(FabArrayBase *this,IntVect *nghost,Box *domain)

{
  _Base_ptr p_Var1;
  bool bVar2;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB180_*>_>
  _Var3;
  RB180 *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB180_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB180_*>_>_>
  pVar4;
  _Alloc_node __an;
  _Alloc_node local_50;
  pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB180_*> local_48;
  
  pVar4 = std::
          _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB180_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB180_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB180_*>_>_>
          ::equal_range((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB180_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB180_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB180_*>_>_>
                         *)m_TheRB180Cache,&this->m_bdkey);
  _Var3 = pVar4.first._M_node;
  while( true ) {
    if (_Var3._M_node == (_Base_ptr)pVar4.second._M_node) {
      this_00 = (RB180 *)operator_new(0x48);
      RB180::RB180(this_00,this,nghost,domain);
      local_48.first.m_ba_id.data = (this->m_bdkey).m_ba_id.data;
      local_48.first.m_dm_id.data = (this->m_bdkey).m_dm_id.data;
      local_50._M_t =
           (_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB180_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB180_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB180_*>_>_>
            *)m_TheRB180Cache;
      local_48.second = this_00;
      std::
      _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB180*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB180*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB180*>>>
      ::
      _M_insert_equal_<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB180*>,std::_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB180*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB180*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB180*>>>::_Alloc_node>
                ((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB180*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB180*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB180*>>>
                  *)m_TheRB180Cache,(_Base_ptr)pVar4.second._M_node,&local_48,&local_50);
      return this_00;
    }
    p_Var1 = _Var3._M_node[1]._M_left;
    if ((((p_Var1[1]._M_color == nghost->vect[0]) &&
         (*(int *)&p_Var1[1].field_0x4 == nghost->vect[1])) &&
        (*(int *)&p_Var1[1]._M_parent == nghost->vect[2])) &&
       (bVar2 = Box::operator==((Box *)((long)&p_Var1[1]._M_parent + 4),domain), bVar2)) break;
    _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node);
  }
  return (RB180 *)_Var3._M_node[1]._M_left;
}

Assistant:

const FabArrayBase::RB180&
FabArrayBase::getRB180 (const IntVect& nghost, const Box& domain) const
{
    BL_PROFILE("FabArrayBase::getRB180()");

    AMREX_ASSERT(getBDKey() == m_bdkey);
    auto er_it = m_TheRB180Cache.equal_range(m_bdkey);
    for (auto it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_ngrow  == nghost &&
            it->second->m_domain == domain)
        {
            return *(it->second);
        }
    }

    RB180* new_rb180 = new RB180(*this, nghost, domain);
    m_TheRB180Cache.insert(er_it.second, RB180Cache::value_type(m_bdkey,new_rb180));

    return *new_rb180;
}